

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

void __thiscall
Centaurus::CATNDeparture<wchar_t>::CATNDeparture
          (CATNDeparture<wchar_t> *this,CharClass<wchar_t> *label,ATNPath *path,int color,
          PriorityChain *priority)

{
  CharClass<wchar_t>::CharClass(&this->m_label,label);
  ATNPath::ATNPath(&this->m_path,path);
  this->m_color = color;
  std::vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>::
  vector(&(this->m_priority).
          super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
         ,&priority->
           super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
        );
  return;
}

Assistant:

CATNDeparture(const CharClass<TCHAR>& label, const ATNPath& path, int color, const PriorityChain& priority)
        : m_label(label), m_path(path), m_color(color), m_priority(priority)
    {
    }